

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall test_concat::build_graph(test_concat *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  char *pcVar3;
  array<long,_4UL> ne_b;
  array<long,_4UL> ne;
  
  ne_b._M_elems[0] = (this->ne_a)._M_elems[0];
  ne_b._M_elems[1] = (this->ne_a)._M_elems[1];
  ne_b._M_elems[2] = (this->ne_a)._M_elems[2];
  ne_b._M_elems[3] = (this->ne_a)._M_elems[3];
  ne_b._M_elems[this->dim] = this->ne_b_d;
  if ((this->v & 1) == 0) {
    pgVar1 = test_case::ggml_new_tensor
                       (&this->super_test_case,ctx,this->type,4,(this->ne_a)._M_elems);
    pcVar3 = "a";
  }
  else {
    ne._M_elems[3] = (this->ne_a)._M_elems[3];
    ne._M_elems[0] = (this->ne_a)._M_elems[0] << 1;
    ne._M_elems[1] = (this->ne_a)._M_elems[1] << 2;
    ne._M_elems[2] = (this->ne_a)._M_elems[2] * 3;
    pgVar1 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,ne._M_elems);
    ggml_set_name(pgVar1,"a");
    pgVar1 = (ggml_tensor *)
             ggml_view_4d(ctx,pgVar1,(this->ne_a)._M_elems[0],(this->ne_a)._M_elems[1],
                          (this->ne_a)._M_elems[2],(this->ne_a)._M_elems[3],(int)pgVar1->nb[1],
                          (int)pgVar1->nb[2],pgVar1->nb[3],0);
    pcVar3 = "view_of_a";
  }
  ggml_set_name(pgVar1,pcVar3);
  if ((this->v & 2) == 0) {
    pgVar2 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,ne_b._M_elems);
    pcVar3 = "b";
  }
  else {
    ne._M_elems[3] = ne_b._M_elems[3];
    ne._M_elems[0] = ne_b._M_elems[0] * 3;
    ne._M_elems[1] = ne_b._M_elems[1] << 1;
    ne._M_elems[2] = ne_b._M_elems[2] << 2;
    pgVar2 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,ne._M_elems);
    ggml_set_name(pgVar2,"b");
    pgVar2 = (ggml_tensor *)
             ggml_view_4d(ctx,pgVar2,ne_b._M_elems[0],ne_b._M_elems[1],ne_b._M_elems[2],
                          ne_b._M_elems[3],(int)pgVar2->nb[1],(int)pgVar2->nb[2],pgVar2->nb[3],0);
    pcVar3 = "view_of_b";
  }
  ggml_set_name(pgVar2,pcVar3);
  pgVar1 = (ggml_tensor *)ggml_concat(ctx,pgVar1,pgVar2,this->dim);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        auto ne_b = ne_a;
        ne_b[dim] = ne_b_d;
        ggml_tensor * a;
        if (v & 1) {
            auto ne = ne_a; ne[0] *= 2; ne[1] *= 4; ne[2] *= 3;
            a = ggml_new_tensor(ctx, type, 4, ne.data());
            ggml_set_name(a, "a");

            a = ggml_view_4d(ctx, a, ne_a[0], ne_a[1], ne_a[2], ne_a[3], a->nb[1], a->nb[2], a->nb[3], 0);
            ggml_set_name(a, "view_of_a");
        } else {
            a = ggml_new_tensor(ctx, type, 4, ne_a.data());
            ggml_set_name(a, "a");
        }
        ggml_tensor * b;
        if (v & 2) {
            auto ne = ne_b; ne[0] *= 3; ne[1] *= 2; ne[2] *= 4;
            b = ggml_new_tensor(ctx, type, 4, ne.data());
            ggml_set_name(b, "b");

            b = ggml_view_4d(ctx, b, ne_b[0], ne_b[1], ne_b[2], ne_b[3], b->nb[1], b->nb[2], b->nb[3], 0);
            ggml_set_name(b, "view_of_b");
        } else {
            b = ggml_new_tensor(ctx, type, 4, ne_b.data());
            ggml_set_name(b, "b");
        }

        ggml_tensor * out = ggml_concat(ctx, a, b, dim);
        ggml_set_name(out, "out");

        return out;
    }